

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O1

void __thiscall hdc::PrettyPrinter::visit(PrettyPrinter *this,CallExpression *expression)

{
  undefined1 *puVar1;
  vector<hdc::Expression_*,_std::allocator<hdc::Expression_*>_> *pvVar2;
  Expression *pEVar3;
  pointer ppEVar4;
  ulong uVar5;
  
  pvVar2 = CallExpression::getArguments(expression);
  pEVar3 = CallExpression::getExpression(expression);
  (**(pEVar3->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar3,this);
  puVar1 = &this->field_0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"(",1);
  if ((pvVar2->super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (pvVar2->super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    ppEVar4 = (pvVar2->super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    uVar5 = 0;
    if ((long)(pvVar2->super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>).
              _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar4 != 8) {
      do {
        (**(ppEVar4[uVar5]->super_Statement).super_ASTNode._vptr_ASTNode)(ppEVar4[uVar5],this);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,", ",2);
        uVar5 = uVar5 + 1;
        ppEVar4 = (pvVar2->super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar5 < ((long)(pvVar2->
                              super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar4 >> 3) - 1U
              );
    }
    (**(ppEVar4[uVar5]->super_Statement).super_ASTNode._vptr_ASTNode)(ppEVar4[uVar5],this);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,")",1);
  return;
}

Assistant:

void PrettyPrinter::visit(CallExpression* expression) {
    int i;
    std::vector<Expression*>& arguments = expression->getArguments();

    expression->getExpression()->accept(this);
    output << "(";

    if (arguments.size() > 0) {
        for (i = 0; i < arguments.size() - 1; ++i) {
            arguments[i]->accept(this);
            output << ", ";
        }

        arguments[i]->accept(this);
    }

    output << ")";
}